

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O3

int Res_FilterCandidatesArea
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax)

{
  long lVar1;
  void **ppvVar2;
  Abc_Obj_t *pNode;
  void *pvVar3;
  void *Entry;
  byte bVar4;
  long lVar5;
  int iVar6;
  uint *puVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  
  if (pSim->vOuts->nSize < 2) {
LAB_0046ad43:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar18 = (ulong)(uint)pSim->nWordsOut;
  while (0 < (int)uVar18) {
    lVar12 = uVar18 * 4;
    uVar18 = uVar18 - 1;
    if (*(int *)((long)pSim->vOuts->pArray[1] + lVar12 + -4) != -1) {
      return 0;
    }
  }
  puVar7 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
  uVar18 = (ulong)(uint)pSim->nWordsOut;
  while (0 < (int)uVar18) {
    lVar12 = uVar18 - 1;
    uVar18 = uVar18 - 1;
    if (puVar7[lVar12] != 0xffffffff) {
      return 0;
    }
  }
  iVar6 = vResubs->nSize;
  if (0 < (long)iVar6) {
    ppvVar2 = vResubs->pArray;
    lVar12 = 0;
    do {
      *(undefined4 *)((long)ppvVar2[lVar12] + 4) = 0;
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  iVar6 = vResubsW->nSize;
  if (0 < (long)iVar6) {
    ppvVar2 = vResubsW->pArray;
    lVar12 = 0;
    do {
      *(undefined4 *)((long)ppvVar2[lVar12] + 4) = 0;
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  pAVar8 = pWin->pNode;
  iVar6 = (pAVar8->vFanins).nSize;
  if (iVar6 < 1) {
    return 0;
  }
  uVar18 = 0xffffffff;
  uVar19 = 0;
  iVar20 = 0;
  do {
    pNode = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[uVar19]];
    if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanouts).nSize < 2)) {
      iVar6 = Res_WinVisitMffc(pNode);
      if (iVar20 < iVar6) {
        uVar18 = uVar19 & 0xffffffff;
      }
      if (iVar20 <= iVar6) {
        iVar20 = iVar6;
      }
      iVar6 = (pAVar8->vFanins).nSize;
    }
    uVar19 = uVar19 + 1;
  } while ((long)uVar19 < (long)iVar6);
  if ((int)uVar18 == -1) {
    return 0;
  }
  bVar4 = (byte)uVar18 & 0x1f;
  puVar7 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
  uVar19 = (ulong)(uint)pSim->nWordsOut;
  do {
    if ((int)uVar19 < 1) {
      if (pAig->vPos->nSize < 1) goto LAB_0046ad43;
      Vec_VecPush(vResubs,0,*pAig->vPos->pArray);
      if (pAig->vPos->nSize < 2) goto LAB_0046ad43;
      Vec_VecPush(vResubs,0,pAig->vPos->pArray[1]);
      pAVar8 = pWin->pNode;
      if ((pAVar8->vFanins).nSize < 1) {
        return 1;
      }
      uVar19 = 0;
      goto LAB_0046a9fc;
    }
    lVar12 = uVar19 - 1;
    uVar19 = uVar19 - 1;
  } while (puVar7[lVar12] == 0xffffffff);
  iVar6 = (pWin->pNode->vFanins).nSize;
  uVar10 = iVar6 + 2;
  pVVar9 = pAig->vPos;
  iVar20 = 0;
  if ((int)uVar10 < pVVar9->nSize) {
    uVar19 = (ulong)uVar10;
    iVar20 = 0;
LAB_0046a7e6:
    if (-3 < iVar6) {
      iVar11 = (int)uVar19;
      if (iVar11 < pSim->vOuts->nSize) {
        uVar10 = (iVar11 - (pWin->pNode->vFanins).nSize) - 2;
        uVar13 = (ulong)(uint)pSim->nWordsOut;
        do {
          if ((int)uVar13 < 1) {
            Vec_VecPush(vResubs,iVar20,*pVVar9->pArray);
            if (pAig->vPos->nSize < 2) goto LAB_0046ad43;
            Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[1]);
            pAVar8 = pWin->pNode;
            if ((pAVar8->vFanins).nSize < 1) goto LAB_0046a8f6;
            uVar13 = 0;
            goto LAB_0046a889;
          }
          lVar12 = uVar13 * 4;
          lVar1 = uVar13 - 1;
          uVar13 = uVar13 - 1;
        } while ((*(uint *)((long)pSim->vOuts->pArray[uVar19] + lVar12 + -4) | puVar7[lVar1]) ==
                 0xffffffff);
        goto LAB_0046a975;
      }
    }
    goto LAB_0046ad43;
  }
LAB_0046aa7d:
  iVar6 = (pWin->pNode->vFanins).nSize;
  if (iVar6 < nFaninsMax) {
    uVar13 = (ulong)(iVar6 + 3);
    uVar19 = (ulong)(iVar6 + 2U);
    do {
      pVVar9 = pAig->vPos;
      iVar11 = (int)uVar19;
      if (pVVar9->nSize <= iVar11) {
        return iVar20;
      }
      if (((int)(iVar6 + 2U) < 0) || (pSim->vOuts->nSize <= iVar11)) goto LAB_0046ad43;
      if ((int)(uVar19 + 1) < pVVar9->nSize) {
        pvVar3 = pSim->vOuts->pArray[uVar19];
        uVar10 = (iVar11 - (pWin->pNode->vFanins).nSize) - 2;
        uVar17 = uVar13;
LAB_0046ab21:
        if (-1 < (int)uVar13) {
          iVar16 = (int)uVar17;
          if (iVar16 < pSim->vOuts->nSize) {
            uVar15 = (iVar16 - (pWin->pNode->vFanins).nSize) - 2;
            uVar14 = (ulong)(uint)pSim->nWordsOut;
            do {
              if ((int)uVar14 < 1) {
                Vec_VecPush(vResubs,iVar20,*pVVar9->pArray);
                if (pAig->vPos->nSize < 2) goto LAB_0046ad43;
                Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[1]);
                pAVar8 = pWin->pNode;
                if ((pAVar8->vFanins).nSize < 1) goto LAB_0046ac32;
                uVar14 = 0;
                goto LAB_0046abc0;
              }
              lVar12 = uVar14 * 4;
              lVar5 = uVar14 - 1;
              lVar1 = uVar14 * 4;
              uVar14 = uVar14 - 1;
            } while ((*(uint *)((long)pvVar3 + lVar12 + -4) | puVar7[lVar5] |
                     *(uint *)((long)pSim->vOuts->pArray[uVar17] + lVar1 + -4)) == 0xffffffff);
            goto LAB_0046ad0e;
          }
        }
        goto LAB_0046ad43;
      }
LAB_0046ad27:
      uVar13 = uVar13 + 1;
      uVar19 = uVar19 + 1;
    } while (iVar20 != vResubs->nSize);
  }
  return iVar20;
LAB_0046a9fc:
  if (uVar18 != uVar19) {
    if (pAig->vPos->nSize <= (int)uVar19 + 2) goto LAB_0046ad43;
    pvVar3 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[uVar19]];
    Vec_VecPush(vResubs,0,pAig->vPos->pArray[uVar19 + 2]);
    Vec_VecPush(vResubsW,0,pvVar3);
    pAVar8 = pWin->pNode;
  }
  uVar19 = uVar19 + 1;
  if ((long)(pAVar8->vFanins).nSize <= (long)uVar19) {
    return 1;
  }
  goto LAB_0046a9fc;
LAB_0046a889:
  do {
    if (uVar18 != uVar13) {
      if (pAig->vPos->nSize <= (int)uVar13 + 2) goto LAB_0046ad43;
      pvVar3 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[uVar13]];
      Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[uVar13 + 2]);
      Vec_VecPush(vResubsW,iVar20,pvVar3);
      pAVar8 = pWin->pNode;
    }
    uVar13 = uVar13 + 1;
  } while ((long)uVar13 < (long)(pAVar8->vFanins).nSize);
LAB_0046a8f6:
  if (((pAig->vPos->nSize <= iVar11) ||
      (Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[uVar19]), (int)uVar10 < 0)) ||
     (pWin->vDivs->nSize <= (int)uVar10)) goto LAB_0046ad43;
  Vec_VecPush(vResubsW,iVar20,pWin->vDivs->pArray[uVar10]);
  iVar20 = iVar20 + 1;
  if (iVar20 == vResubs->nSize) goto LAB_0046aa74;
  pVVar9 = pAig->vPos;
LAB_0046a975:
  uVar19 = uVar19 + 1;
  if (pVVar9->nSize <= (int)uVar19) goto LAB_0046aa74;
  goto LAB_0046a7e6;
LAB_0046aa74:
  if (0 < iVar20) {
    return iVar20;
  }
  goto LAB_0046aa7d;
LAB_0046abc0:
  do {
    if (uVar18 != uVar14) {
      if (pAig->vPos->nSize <= (int)uVar14 + 2) goto LAB_0046ad43;
      Entry = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[uVar14]];
      Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[uVar14 + 2]);
      Vec_VecPush(vResubsW,iVar20,Entry);
      pAVar8 = pWin->pNode;
    }
    uVar14 = uVar14 + 1;
  } while ((long)uVar14 < (long)(pAVar8->vFanins).nSize);
LAB_0046ac32:
  if (pAig->vPos->nSize <= iVar11) goto LAB_0046ad43;
  Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[uVar19]);
  if (((pAig->vPos->nSize <= iVar16) ||
      (Vec_VecPush(vResubs,iVar20,pAig->vPos->pArray[uVar17]), (int)uVar10 < 0)) ||
     ((pWin->vDivs->nSize <= (int)uVar10 ||
      ((Vec_VecPush(vResubsW,iVar20,pWin->vDivs->pArray[uVar10]), (int)uVar15 < 0 ||
       (pWin->vDivs->nSize <= (int)uVar15)))))) goto LAB_0046ad43;
  Vec_VecPush(vResubsW,iVar20,pWin->vDivs->pArray[uVar15]);
  iVar20 = iVar20 + 1;
  if (iVar20 == vResubs->nSize) goto LAB_0046ad27;
  pVVar9 = pAig->vPos;
LAB_0046ad0e:
  uVar17 = uVar17 + 1;
  if (pVVar9->nSize <= (int)uVar17) goto LAB_0046ad27;
  goto LAB_0046ab21;
}

Assistant:

int Res_FilterCandidatesArea( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax )
{
    Abc_Obj_t * pFanin;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, d, d2, k, iDiv, iDiv2, iBest;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing fanins
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    // get the best fanins
    iBest = Res_FilterCriticalFanin( pWin->pNode );
    if ( iBest == -1 )
        return 0;

    // get the info without the critical fanin
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << iBest) );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue )
    {
//        printf( "Can be done without one!\n" );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        Counter++;
//        printf( "*" );
        return Counter;
    }

    // go through the divisors
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
            continue;
//if ( Abc_ObjLevel(pWin->pNode) <= Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) )
//    printf( "Node level = %d. Divisor level = %d.\n", Abc_ObjLevel(pWin->pNode), Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        // collect the remaning fanins and the divisor
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        // collect the divisor
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
        Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
        Counter++;

        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }

    if ( Counter > 0 || Abc_ObjFaninNum(pWin->pNode) >= nFaninsMax )
        return Counter;

    // try to find the node pairs
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        // go through the second divisor
        for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
        {
            pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
            iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);

            if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
            {
                if ( k != iBest )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFanin );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
            Counter++;

            if ( Counter == Vec_VecSize(vResubs) )
                break;            
        }
        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }
    return Counter;
}